

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void asio::detail::executor_function::
     complete<asio::detail::binder1<fineftp::FtpServerImpl::acceptFtpSession(std::shared_ptr<fineftp::FtpSession>,std::error_code_const&)::__0,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  undefined1 local_68 [8];
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
  function;
  ptr p;
  allocator<void> allocator;
  impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>,_std::allocator<void>_>
  *i;
  bool call_local;
  impl_base *base_local;
  
  function.arg1_._M_cat = (error_category *)((long)&p.p + 7);
  p.a = (allocator<void> *)base;
  p.v = base;
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>
  ::binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
             *)local_68,
            (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
             *)(base + 1));
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset((ptr *)&function.arg1_._M_cat);
  if (call) {
    asio_handler_invoke_helpers::
    invoke<asio::detail::binder1<fineftp::FtpServerImpl::acceptFtpSession(std::shared_ptr<fineftp::FtpSession>,std::error_code_const&)::__0,std::error_code>,asio::detail::binder1<fineftp::FtpServerImpl::acceptFtpSession(std::shared_ptr<fineftp::FtpSession>,std::error_code_const&)::__0,std::error_code>>
              ((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
                *)local_68,
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
                *)local_68);
  }
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>
  ::~binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_server_impl_cpp:135:29),_std::error_code>
              *)local_68);
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/server_impl.cpp:135:29),_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)&function.arg1_._M_cat);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }